

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O0

void test_abs<short>(uint length)

{
  short sVar1;
  short sVar2;
  short *__p;
  element_type *pSrc;
  undefined8 *puVar3;
  int local_40;
  int i_1;
  int local_2c;
  int i;
  short *v;
  shared_ptr<short> pv;
  uint length_local;
  
  pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = length;
  __p = nosimd::common::malloc<short>(length);
  std::shared_ptr<short>::shared_ptr<short,void(*)(short*),void>
            ((shared_ptr<short> *)&v,__p,nosimd::common::free<short>);
  pSrc = std::__shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<short,_(__gnu_cxx::_Lock_policy)2> *)&v);
  for (local_2c = 0;
      local_2c <
      (int)pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      local_2c = local_2c + 1) {
    pSrc[local_2c] = -(short)local_2c;
  }
  nosimd::arithmetic::abs<short>
            (pSrc,pSrc,
             pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_);
  local_40 = 0;
  do {
    if ((int)pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <=
        local_40) {
      std::shared_ptr<short>::~shared_ptr((shared_ptr<short> *)&v);
      return;
    }
    if (pSrc[local_40] < 0) {
      sVar1 = pSrc[local_40];
      sVar2 = std::numeric_limits<short>::min();
      if (sVar1 != sVar2) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar3 = "void test_abs(unsigned int) [T = short]";
        *(undefined4 *)(puVar3 + 1) = 0x81;
        *(uint *)((long)puVar3 + 0xc) =
             pv.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}